

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void zng_tr_flush_bits(deflate_state *s)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  sbyte sVar4;
  
  iVar3 = s->bi_valid;
  if (iVar3 < 0x30) {
    if (iVar3 < 0x20) goto LAB_0010b1f5;
    *(int *)(s->pending_buf + s->pending) = (int)s->bi_buf;
    iVar3 = -0x20;
    sVar4 = 0x20;
    iVar1 = 4;
  }
  else {
    *(int *)(s->pending_buf + s->pending) = (int)s->bi_buf;
    uVar2 = s->pending + 4;
    s->pending = uVar2;
    *(undefined2 *)(s->pending_buf + uVar2) = *(undefined2 *)((long)&s->bi_buf + 4);
    iVar3 = -0x30;
    sVar4 = 0x30;
    iVar1 = 2;
  }
  s->pending = s->pending + iVar1;
  s->bi_buf = s->bi_buf >> sVar4;
  iVar3 = iVar3 + s->bi_valid;
  s->bi_valid = iVar3;
LAB_0010b1f5:
  if (0xf < iVar3) {
    *(short *)(s->pending_buf + s->pending) = (short)s->bi_buf;
    s->pending = s->pending + 2;
    s->bi_buf = s->bi_buf >> 0x10;
    iVar3 = s->bi_valid + -0x10;
    s->bi_valid = iVar3;
  }
  if (7 < iVar3) {
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (uchar)s->bi_buf;
    s->bi_buf = s->bi_buf >> 8;
    s->bi_valid = s->bi_valid + -8;
  }
  return;
}

Assistant:

void Z_INTERNAL zng_tr_flush_bits(deflate_state *s) {
    if (s->bi_valid >= 48) {
        put_uint32(s, (uint32_t)s->bi_buf);
        put_short(s, (uint16_t)(s->bi_buf >> 32));
        s->bi_buf >>= 48;
        s->bi_valid -= 48;
    } else if (s->bi_valid >= 32) {
        put_uint32(s, (uint32_t)s->bi_buf);
        s->bi_buf >>= 32;
        s->bi_valid -= 32;
    }
    if (s->bi_valid >= 16) {
        put_short(s, (uint16_t)s->bi_buf);
        s->bi_buf >>= 16;
        s->bi_valid -= 16;
    }
    if (s->bi_valid >= 8) {
        put_byte(s, s->bi_buf);
        s->bi_buf >>= 8;
        s->bi_valid -= 8;
    }
}